

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O1

void __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QString,_QChar>,_const_char_(&)[12]>,_ProString>::
~QStringBuilder(QStringBuilder<QStringBuilder<QStringBuilder<QString,_QChar>,_const_char_(&)[12]>,_ProString>
                *this)

{
  Data *pDVar1;
  
  pDVar1 = (this->b).m_string.d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)(pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
      QArrayData::deallocate(&((this->b).m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  pDVar1 = (this->a).a.a.d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_ =
         (QBasicAtomicInt)(*(int *)&(pDVar1->super_QArrayData).ref_ + -1);
    UNLOCK();
    if (*(int *)&(pDVar1->super_QArrayData).ref_ == 0) {
      QArrayData::deallocate(&((this->a).a.a.d.d)->super_QArrayData,2,0x10);
      return;
    }
  }
  return;
}

Assistant:

~QStringBuilder() = default;